

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSpace.cpp
# Opt level: O0

RealSpace * __thiscall
mnf::RealSpace::toString(RealSpace *this,ConstRefVec *val,string *prefix,IOFormat *fmt)

{
  ostream *s;
  IOFormat *in_R8;
  non_const_type local_2c8;
  WithFormat<Eigen::Transpose<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>_>
  local_2c0;
  stringstream local_1b8 [8];
  stringstream ss;
  ostream local_1a8 [376];
  IOFormat *local_30;
  IOFormat *fmt_local;
  string *prefix_local;
  ConstRefVec *val_local;
  RealSpace *this_local;
  
  local_30 = in_R8;
  fmt_local = fmt;
  prefix_local = prefix;
  val_local = val;
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1b8);
  s = std::operator<<(local_1a8,(string *)fmt_local);
  local_2c8 = (non_const_type)
              Eigen::
              DenseBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
              ::transpose((DenseBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                           *)prefix_local);
  Eigen::
  DenseBase<Eigen::Transpose<const_Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>_>
  ::format(&local_2c0,
           (DenseBase<Eigen::Transpose<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>_>
            *)&local_2c8,local_30);
  Eigen::operator<<(s,&local_2c0);
  Eigen::
  WithFormat<Eigen::Transpose<const_Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>_>
  ::~WithFormat(&local_2c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return this;
}

Assistant:

std::string RealSpace::toString(const ConstRefVec& val,
                                const std::string& prefix,
                                const Eigen::IOFormat& fmt) const
{
  std::stringstream ss;
  ss << prefix << val.transpose().format(fmt);
  return ss.str();
}